

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.cpp
# Opt level: O0

int anon_unknown.dwarf_1ec2f07::timingsafe_bcmp_internal(uchar *b1,uchar *b2,size_t n)

{
  byte bVar1;
  long in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  int ret;
  uchar *p2;
  uchar *p1;
  byte *local_30;
  byte *local_28;
  long local_20;
  
  bVar1 = 0;
  local_30 = in_RSI;
  local_28 = in_RDI;
  for (local_20 = in_RDX; local_20 != 0; local_20 = local_20 + -1) {
    bVar1 = *local_28 ^ *local_30 | bVar1;
    local_30 = local_30 + 1;
    local_28 = local_28 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (uint)(bVar1 != 0);
  }
  __stack_chk_fail();
}

Assistant:

int timingsafe_bcmp_internal(const unsigned char* b1, const unsigned char* b2, size_t n) noexcept
{
    const unsigned char *p1 = b1, *p2 = b2;
    int ret = 0;
    for (; n > 0; n--)
        ret |= *p1++ ^ *p2++;
    return (ret != 0);
}